

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

int sockopt_callback(void *clientp,curl_socket_t curlfd,curlsocktype purpose)

{
  uint uVar1;
  GlobalConfig *pGVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  char *pcVar6;
  uint local_38;
  int error_1;
  int priority;
  int error;
  int result;
  int tos;
  OperationConfig *config;
  curlsocktype purpose_local;
  curl_socket_t curlfd_local;
  void *clientp_local;
  
  if (purpose == CURLSOCKTYPE_IPCXN) {
    _result = clientp;
    config._0_4_ = purpose;
    config._4_4_ = curlfd;
    _purpose_local = clientp;
    if (0 < *(long *)((long)clientp + 0x418)) {
      error = *(int *)((long)clientp + 0x418);
      priority = 0;
      iVar4 = get_address_family(curlfd);
      if (iVar4 == 2) {
        priority = setsockopt(config._4_4_,0,1,&error,4);
      }
      else if (iVar4 == 10) {
        priority = setsockopt(config._4_4_,0x29,0x43,&error,4);
      }
      if (priority < 0) {
        puVar5 = (uint *)__errno_location();
        iVar4 = error;
        uVar1 = *puVar5;
        pGVar2 = *(GlobalConfig **)((long)_result + 0x3b0);
        error_1 = uVar1;
        pcVar6 = strerror(uVar1);
        warnf(pGVar2,"Setting type of service to %d failed with errno %d: %s;\n",(ulong)(uint)iVar4,
              (ulong)uVar1,pcVar6);
      }
    }
    if (0 < *(long *)((long)_result + 0x420)) {
      local_38 = (uint)*(undefined8 *)((long)_result + 0x420);
      iVar4 = setsockopt(config._4_4_,1,0xc,&local_38,4);
      if (iVar4 != 0) {
        puVar5 = (uint *)__errno_location();
        uVar3 = local_38;
        uVar1 = *puVar5;
        pGVar2 = *(GlobalConfig **)((long)_result + 0x3b0);
        pcVar6 = strerror(uVar1);
        warnf(pGVar2,"VLAN priority %d failed with errno %d: %s;\n",(ulong)uVar3,(ulong)uVar1,pcVar6
             );
      }
    }
  }
  return 0;
}

Assistant:

static int sockopt_callback(void *clientp, curl_socket_t curlfd,
                            curlsocktype purpose)
{
  struct OperationConfig *config = (struct OperationConfig *)clientp;
  if(purpose != CURLSOCKTYPE_IPCXN)
    return CURL_SOCKOPT_OK;
  (void)config;
  (void)curlfd;
#if defined(IP_TOS) || defined(IPV6_TCLASS)
  if(config->ip_tos > 0) {
    int tos = (int)config->ip_tos;
    int result = 0;
    switch(get_address_family(curlfd)) {
    case AF_INET:
#ifdef IP_TOS
      result = setsockopt(curlfd, SOL_IP, IP_TOS, (void *)&tos, sizeof(tos));
#endif
      break;
#if defined(IPV6_TCLASS) && defined(AF_INET6)
    case AF_INET6:
      result = setsockopt(curlfd, IPPROTO_IPV6, IPV6_TCLASS,
                          (void *)&tos, sizeof(tos));
      break;
#endif
    }
    if(result < 0) {
      int error = errno;
      warnf(config->global,
            "Setting type of service to %d failed with errno %d: %s;\n",
            tos, error, strerror(error));
    }
  }
#endif
#ifdef SO_PRIORITY
  if(config->vlan_priority > 0) {
    int priority = (int)config->vlan_priority;
    if(setsockopt(curlfd, SOL_SOCKET, SO_PRIORITY,
      (void *)&priority, sizeof(priority)) != 0) {
      int error = errno;
      warnf(config->global, "VLAN priority %d failed with errno %d: %s;\n",
            priority, error, strerror(error));
    }
  }
#endif
  return CURL_SOCKOPT_OK;
}